

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void my_reflection_example(void)

{
  ChValue *pCVar1;
  pointer ppCVar2;
  bool bVar3;
  int iVar4;
  ChStreamOutAscii *pCVar5;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> *pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppCVar7;
  pointer ppCVar8;
  char *pcVar9;
  allocator local_561;
  int my_foo;
  int my_age;
  vector<myEmployee,_std::allocator<myEmployee>_> mcontainer;
  double my_wages;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> props2;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> props;
  myEmployee a_employee;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  ChArchiveExplorer mexplorer2;
  myEmployee my_slave;
  myEmployeeBoss m_boss;
  ChArchiveExplorer mexplorer;
  
  chrono::ChArchiveExplorer::ChArchiveExplorer(&mexplorer);
  mexplorer.use_wildcards = true;
  mexplorer.use_user_names = true;
  myEmployeeBoss::myEmployeeBoss(&m_boss,0x47,42000.4,true);
  m_boss.super_myEmployee.body = FAT;
  std::__cxx11::string::string((string *)&mexplorer2,"wages",(allocator *)&my_slave);
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,double>
                    (&mexplorer,&my_wages,&m_boss,(string *)&mexplorer2);
  std::__cxx11::string::~string((string *)&mexplorer2);
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,"Property explorer : retrieved \'wages\'=")
    ;
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,my_wages);
    pcVar9 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar9 = "Property explorer : cannot retrieve \'wages\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar9);
  std::__cxx11::string::string((string *)&local_438,"John",(allocator *)&mexplorer2);
  myEmployee::myEmployee(&my_slave,0x12,1020.3,ATHLETIC,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string((string *)&mexplorer2,"slave",(allocator *)&a_employee);
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
                    (&mexplorer,&my_slave,&m_boss,(string *)&mexplorer2);
  std::__cxx11::string::~string((string *)&mexplorer2);
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,"Property explorer : retrieved \'slave\'=\n");
    pCVar5 = chrono::operator<<(pCVar5,&my_slave);
    pcVar9 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar9 = "Property explorer : cannot retrieve \'slave\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar9);
  std::__cxx11::string::string((string *)&mexplorer2,"s?*e/age",(allocator *)&a_employee);
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,int>
                    (&mexplorer,&my_age,&m_boss,(string *)&mexplorer2);
  std::__cxx11::string::~string((string *)&mexplorer2);
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,"Property explorer : retrieved \'slave/age\'=");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,my_age);
    pcVar9 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar9 = "Property explorer : cannot retrieve \'slave/age\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar9);
  my_foo = 0x7b;
  std::__cxx11::string::string((string *)&mexplorer2,"foo",(allocator *)&a_employee);
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,int>
                    (&mexplorer,&my_foo,&m_boss,(string *)&mexplorer2);
  std::__cxx11::string::~string((string *)&mexplorer2);
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,"Property explorer : retrieved \'int foo\'=");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,my_foo);
    pcVar9 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar9 = "Property explorer : cannot retrieve \'int foo\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar9);
  mcontainer.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mcontainer.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mcontainer.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_458,"Josh",(allocator *)&a_employee);
  myEmployee::myEmployee((myEmployee *)&mexplorer2,0x13,4000.0,ATHLETIC,&local_458);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::emplace_back<myEmployee>
            (&mcontainer,(myEmployee *)&mexplorer2);
  myEmployee::~myEmployee((myEmployee *)&mexplorer2);
  std::__cxx11::string::~string((string *)&local_458);
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)&mexplorer2,0x1d,5000.0,true);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::emplace_back<myEmployee>
            (&mcontainer,(myEmployee *)&mexplorer2);
  myEmployeeBoss::~myEmployeeBoss((myEmployeeBoss *)&mexplorer2);
  std::__cxx11::string::string((string *)&local_478,"Marie",(allocator *)&a_employee);
  myEmployee::myEmployee((myEmployee *)&mexplorer2,0x1f,6000.0,ATHLETIC,&local_478);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::emplace_back<myEmployee>
            (&mcontainer,(myEmployee *)&mexplorer2);
  myEmployee::~myEmployee((myEmployee *)&mexplorer2);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::string((string *)&local_498,"John",(allocator *)&mexplorer2);
  myEmployee::myEmployee(&a_employee,0x12,1020.3,ATHLETIC,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::string((string *)&mexplorer2,"1",(allocator *)&local_4b8);
  bVar3 = chrono::ChArchiveExplorer::
          FetchValue<std::vector<myEmployee,std::allocator<myEmployee>>,myEmployee>
                    (&mexplorer,&a_employee,&mcontainer,(string *)&mexplorer2);
  std::__cxx11::string::~string((string *)&mexplorer2);
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,
                        "Property explorer : retrieved from element number in container \'1\' =\n");
    pCVar5 = chrono::operator<<(pCVar5,&a_employee);
    pcVar9 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar9 = "Property explorer : cannot retrieve from element number! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar9);
  std::__cxx11::string::string((string *)&mexplorer2,"\'Marie\'",(allocator *)&local_4b8);
  bVar3 = chrono::ChArchiveExplorer::
          FetchValue<std::vector<myEmployee,std::allocator<myEmployee>>,myEmployee>
                    (&mexplorer,&a_employee,&mcontainer,(string *)&mexplorer2);
  std::__cxx11::string::~string((string *)&mexplorer2);
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,
                        "Property explorer : retrieved from element container name \'Marie\' =\n");
    pCVar5 = chrono::operator<<(pCVar5,&a_employee);
    pcVar9 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar9 = "Property explorer : cannot retrieve from element container name! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar9);
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar5 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar5,"This has sub properties? : ");
  bVar3 = chrono::ChArchiveExplorer::IsObject<std::vector<myEmployee,std::allocator<myEmployee>>>
                    (&mexplorer,&mcontainer);
  pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,bVar3);
  chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar5 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar5,"This has sub properties? : ");
  bVar3 = chrono::ChArchiveExplorer::IsObject<int>(&mexplorer,&my_age);
  pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,bVar3);
  chrono::ChStreamOutAscii::operator<<(pCVar5,"\n\n");
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar5,"List of fetched properties in std::vector of employees: \n");
  std::__cxx11::string::string((string *)&mexplorer2,"*",(allocator *)&local_4b8);
  pvVar6 = chrono::ChArchiveExplorer::
           FetchValues<std::vector<myEmployee,std::allocator<myEmployee>>>
                     (&mexplorer,&mcontainer,(string *)&mexplorer2);
  std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::vector(&props,pvVar6);
  std::__cxx11::string::~string((string *)&mexplorer2);
  for (ppCVar7 = props.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar7 !=
      props.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
    pCVar1 = *ppCVar7;
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," val: ");
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,(pCVar1->_name)._M_dataplus._M_p);
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  reg.class: ");
    iVar4 = (*pCVar1->_vptr_ChValue[3])(pCVar1);
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,(string *)CONCAT44(extraout_var,iVar4));
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  typeid: ");
    iVar4 = (*pCVar1->_vptr_ChValue[5])(pCVar1);
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,(char *)CONCAT44(extraout_var_00,iVar4));
    chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
    chrono::ChArchiveExplorer::ChArchiveExplorer(&mexplorer2);
    std::__cxx11::string::string((string *)&local_4b8,"*",&local_561);
    pvVar6 = chrono::ChArchiveExplorer::FetchValues(&mexplorer2,pCVar1,&local_4b8);
    std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::vector(&props2,pvVar6);
    std::__cxx11::string::~string((string *)&local_4b8);
    ppCVar2 = props2.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar8 = props2.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppCVar8 != ppCVar2;
        ppCVar8 = ppCVar8 + 1) {
      pCVar1 = *ppCVar8;
      pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,"    val: ");
      pCVar5 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<(pCVar5,(pCVar1->_name)._M_dataplus._M_p);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  reg.class: ");
      iVar4 = (*pCVar1->_vptr_ChValue[3])(pCVar1);
      pCVar5 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<
                         (pCVar5,(string *)CONCAT44(extraout_var_01,iVar4));
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  typeid: ");
      iVar4 = (*pCVar1->_vptr_ChValue[5])(pCVar1);
      pCVar5 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<(pCVar5,(char *)CONCAT44(extraout_var_02,iVar4));
      chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
    }
    std::_Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::~_Vector_base
              (&props2.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>);
    chrono::ChArchiveExplorer::~ChArchiveExplorer(&mexplorer2);
  }
  std::_Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::~_Vector_base
            (&props.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>);
  myEmployee::~myEmployee(&a_employee);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::~vector(&mcontainer);
  myEmployee::~myEmployee(&my_slave);
  myEmployeeBoss::~myEmployeeBoss(&m_boss);
  chrono::ChArchiveExplorer::~ChArchiveExplorer(&mexplorer);
  return;
}

Assistant:

void my_reflection_example()
{
    ChArchiveExplorer mexplorer;
    mexplorer.SetUseWildcards(true);
    mexplorer.SetUseUserNames(true);

    myEmployeeBoss m_boss(71, 42000.4, true);
    m_boss.body = FAT;

    double my_wages;
    if (mexplorer.FetchValue(my_wages, m_boss, "wages"))
        GetLog() << "Property explorer : retrieved 'wages'=" << my_wages << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'wages'! \n";

    myEmployee my_slave;
    if (mexplorer.FetchValue(my_slave, m_boss, "slave"))
        GetLog() << "Property explorer : retrieved 'slave'=\n" << my_slave << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'slave'! \n";

    int my_age;
    if (mexplorer.FetchValue(my_age, m_boss, "s?*e/age"))
        GetLog() << "Property explorer : retrieved 'slave/age'=" << my_age << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'slave/age'! \n";

    int my_foo = 123;
    if (mexplorer.FetchValue(my_foo, m_boss, "foo"))
        GetLog() << "Property explorer : retrieved 'int foo'=" << my_foo << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'int foo'! \n";

    // Test access to containers (std::vector, arrays, etc.). Elements can
    // be fetched using two approaches: integer indexes or menmonic names.
    std::vector<myEmployee> mcontainer;
    mcontainer.push_back(myEmployee(19,4000,ATHLETIC, "Josh"));
    mcontainer.push_back(myEmployeeBoss(29,5000, "Jeff"));
    mcontainer.push_back(myEmployee(31,6000,ATHLETIC, "Marie"));
    myEmployee a_employee;

    // Method A: just use the index in the search string, 
    //   ex: "stuff/arrayofpositions/6/x" as in:

    if (mexplorer.FetchValue(a_employee, mcontainer, "1"))
        GetLog() << "Property explorer : retrieved from element number in container '1' =\n" << a_employee << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve from element number! \n";

    // Method B: if you deal if working with objects that implement 
    // ArchiveContainerName(), you can use the name between single quotation marks '...',
    //   ex: "stuff/arrayofbodies/'Crank'/mass" as in:
    if (mexplorer.FetchValue(a_employee, mcontainer, "'Marie'"))
        GetLog() << "Property explorer : retrieved from element container name 'Marie' =\n" << a_employee << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve from element container name! \n";

    // Test if some object can be explored
    GetLog() << "This has sub properties? : " << mexplorer.IsObject(mcontainer) << "\n";
    GetLog() << "This has sub properties? : " << mexplorer.IsObject(my_age) << "\n\n";

    // Fetch all subproperties of an object using "*"
    GetLog() << "List of fetched properties in std::vector of employees: \n";
    auto props = mexplorer.FetchValues(mcontainer, "*");
    for (auto i : props) {
        GetLog() << " val: " << i->name() << ",  reg.class: " << i->GetClassRegisteredName() << ",  typeid: " << i->GetTypeidName() << "\n";
        //if (auto pi = dynamic_cast<myEmployeeBoss*>(i->PointerUpCast<myEmployee>()))
        //    GetLog() <<"   castable to myEmployeeBoss \n";
        ChArchiveExplorer mexplorer2;
        auto props2 = mexplorer2.FetchValues(*i, "*");
        for (auto i2 : props2) {
            GetLog() << "    val: " << i2->name() << ",  reg.class: " << i2->GetClassRegisteredName() << ",  typeid: " << i2->GetTypeidName() << "\n";
        }
    }
}